

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

char * __thiscall tinyxml2::XMLAttribute::ParseDeep(XMLAttribute *this,char *p,bool processEntities)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  byte *pbVar5;
  char endTag [2];
  byte local_1a [2];
  
  pbVar3 = (byte *)StrPair::ParseName(&this->_name,p);
  if ((pbVar3 != (byte *)0x0) && (bVar1 = *pbVar3, bVar1 != 0)) {
    while ((-1 < (char)bVar1 && (iVar2 = isspace((uint)bVar1), iVar2 != 0))) {
      bVar1 = pbVar3[1];
      pbVar3 = pbVar3 + 1;
    }
    if (*pbVar3 == 0x3d) {
      do {
        pbVar5 = pbVar3;
        pbVar3 = pbVar5 + 1;
        if ((char)pbVar5[1] < '\0') break;
        iVar2 = isspace((uint)pbVar5[1]);
      } while (iVar2 != 0);
      if ((*pbVar3 == 0x27) || (*pbVar3 == 0x22)) {
        local_1a[0] = *pbVar3;
        local_1a[1] = 0;
        pcVar4 = StrPair::ParseText(&this->_value,(char *)(pbVar5 + 2),(char *)local_1a,
                                    processEntities | 2);
        return pcVar4;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char* XMLAttribute::ParseDeep( char* p, bool processEntities )
{
    // Parse using the name rules: bug fix, was using ParseText before
    p = _name.ParseName( p );
    if ( !p || !*p ) {
        return 0;
    }

    // Skip white space before =
    p = XMLUtil::SkipWhiteSpace( p );
    if ( *p != '=' ) {
        return 0;
    }

    ++p;	// move up to opening quote
    p = XMLUtil::SkipWhiteSpace( p );
    if ( *p != '\"' && *p != '\'' ) {
        return 0;
    }

    char endTag[2] = { *p, 0 };
    ++p;	// move past opening quote

    p = _value.ParseText( p, endTag, processEntities ? StrPair::ATTRIBUTE_VALUE : StrPair::ATTRIBUTE_VALUE_LEAVE_ENTITIES );
    return p;
}